

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiColumnsSet *pIVar1;
  ImGuiColumnData *pIVar2;
  
  pIVar1 = (GImGui->CurrentWindow->DC).ColumnsSet;
  if (column_index < 0) {
    column_index = pIVar1->Current;
  }
  pIVar2 = (pIVar1->Columns).Data;
  return (pIVar1->MaxX - pIVar1->MinX) *
         (pIVar2[(long)column_index + 1].OffsetNorm - pIVar2[column_index].OffsetNorm);
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }